

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::~BinaryInstWriter(BinaryInstWriter *this)

{
  std::
  _Hashtable<wasm::Break_*,_std::pair<wasm::Break_*const,_wasm::Type>,_std::allocator<std::pair<wasm::Break_*const,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Break_*>,_std::hash<wasm::Break_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->brIfsNeedingHandling)._M_h);
  std::
  _Hashtable<wasm::LocalGet_*,_wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>,_std::__detail::_Identity,_std::equal_to<wasm::LocalGet_*>,_std::hash<wasm::LocalGet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->deferredGets)._M_h);
  std::
  _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_unsigned_int>,_std::allocator<std::pair<wasm::Expression_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->extractedGets)._M_h);
  InsertOrderedMap<wasm::Type,_unsigned_int>::~InsertOrderedMap(&this->scratchLocals);
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->numLocalsByType)._M_h);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            (&(this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>);
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            (&(this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)this);
  return;
}

Assistant:

BinaryInstWriter(WasmBinaryWriter& parent,
                   BufferWithRandomAccess& o,
                   Function* func,
                   bool sourceMap,
                   bool DWARF)
    : parent(parent), o(o), func(func), sourceMap(sourceMap), DWARF(DWARF) {}